

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O0

int yaml_emitter_dump(yaml_emitter_t *emitter,yaml_document_t *document)

{
  int iVar1;
  yaml_anchors_t *pyVar2;
  undefined1 local_a0 [8];
  yaml_mark_t mark;
  yaml_event_t event;
  yaml_document_t *document_local;
  yaml_emitter_t *emitter_local;
  
  memset(local_a0,0,0x18);
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                  ,0x75,"int yaml_emitter_dump(yaml_emitter_t *, yaml_document_t *)");
  }
  if (document != (yaml_document_t *)0x0) {
    emitter->document = document;
    if ((emitter->opened != 0) || (iVar1 = yaml_emitter_open(emitter), iVar1 != 0)) {
      if ((document->nodes).start == (document->nodes).top) {
        iVar1 = yaml_emitter_close(emitter);
        if (iVar1 != 0) {
          yaml_emitter_delete_document_and_anchors(emitter);
          return 1;
        }
      }
      else {
        if (emitter->opened == 0) {
          __assert_fail("emitter->opened",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                        ,0x84,"int yaml_emitter_dump(yaml_emitter_t *, yaml_document_t *)");
        }
        pyVar2 = (yaml_anchors_t *)
                 yaml_malloc((((long)(document->nodes).top - (long)(document->nodes).start) / 0x60)
                             * 0xc);
        emitter->anchors = pyVar2;
        if (emitter->anchors != (yaml_anchors_t *)0x0) {
          memset(emitter->anchors,0,
                 (((long)(document->nodes).top - (long)(document->nodes).start) / 0x60) * 0xc);
          memset(&mark.column,0,0x68);
          mark.column._0_4_ = 3;
          iVar1 = yaml_emitter_emit(emitter,(yaml_event_t *)&mark.column);
          if (iVar1 != 0) {
            yaml_emitter_anchor_node(emitter,1);
            iVar1 = yaml_emitter_dump_node(emitter,1);
            if (iVar1 != 0) {
              memset(&mark.column,0,0x68);
              mark.column._0_4_ = 4;
              iVar1 = yaml_emitter_emit(emitter,(yaml_event_t *)&mark.column);
              if (iVar1 != 0) {
                yaml_emitter_delete_document_and_anchors(emitter);
                return 1;
              }
            }
          }
        }
      }
    }
    yaml_emitter_delete_document_and_anchors(emitter);
    return 0;
  }
  __assert_fail("document",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                ,0x76,"int yaml_emitter_dump(yaml_emitter_t *, yaml_document_t *)");
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_dump(yaml_emitter_t *emitter, yaml_document_t *document)
{
    yaml_event_t event;
    yaml_mark_t mark = { 0, 0, 0 };

    assert(emitter);            /* Non-NULL emitter object is required. */
    assert(document);           /* Non-NULL emitter object is expected. */

    emitter->document = document;

    if (!emitter->opened) {
        if (!yaml_emitter_open(emitter)) goto error;
    }

    if (STACK_EMPTY(emitter, document->nodes)) {
        if (!yaml_emitter_close(emitter)) goto error;
        yaml_emitter_delete_document_and_anchors(emitter);
        return 1;
    }

    assert(emitter->opened);    /* Emitter should be opened. */

    emitter->anchors = (yaml_anchors_t*)yaml_malloc(sizeof(*(emitter->anchors))
            * (document->nodes.top - document->nodes.start));
    if (!emitter->anchors) goto error;
    memset(emitter->anchors, 0, sizeof(*(emitter->anchors))
            * (document->nodes.top - document->nodes.start));

    DOCUMENT_START_EVENT_INIT(event, document->version_directive,
            document->tag_directives.start, document->tag_directives.end,
            document->start_implicit, mark, mark);
    if (!yaml_emitter_emit(emitter, &event)) goto error;

    yaml_emitter_anchor_node(emitter, 1);
    if (!yaml_emitter_dump_node(emitter, 1)) goto error;

    DOCUMENT_END_EVENT_INIT(event, document->end_implicit, mark, mark);
    if (!yaml_emitter_emit(emitter, &event)) goto error;

    yaml_emitter_delete_document_and_anchors(emitter);

    return 1;

error:

    yaml_emitter_delete_document_and_anchors(emitter);

    return 0;
}